

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64ad_(int_t *job,int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int_t *num,int *cperm,
             int_t *liw,int_t *iw,int_t *ldw,double *dw,int_t *icntl,int_t *info)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int_t iVar10;
  uint uVar11;
  undefined8 uVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double local_48;
  
  dVar20 = dmach("Overflow");
  uVar15 = *job;
  if (uVar15 - 6 < 0xfffffffb) {
    *info = -1;
    uVar17 = (ulong)(uint)*job;
    info[1] = *job;
    if (*icntl < 0) {
      return 0;
    }
    pcVar13 = " ****** Error in MC64A/AD. INFO(1) = %2d because JOB = %d\n";
    uVar12 = 0xffffffff;
    goto LAB_001112c6;
  }
  uVar2 = *n;
  if ((long)(int)uVar2 < 1) {
    *info = -2;
    info[1] = *n;
    if (*icntl < 0) {
      return 0;
    }
    uVar17 = (ulong)(uint)*job;
    pcVar13 = " ****** Error in MC64A/AD. INFO(1) = %2d because N = %d\n";
    uVar12 = 0xfffffffe;
    goto LAB_001112c6;
  }
  uVar3 = *ne;
  if ((int)uVar3 < 1) {
    *info = -3;
    info[1] = *ne;
    if (*icntl < 0) {
      return 0;
    }
    uVar17 = (ulong)(uint)*job;
    pcVar13 = " ****** Error in MC64A/AD. INFO(1) = %2d because NE = %d\n";
    uVar12 = 0xfffffffd;
    goto LAB_001112c6;
  }
  uVar11 = uVar2 * 5;
  uVar17 = (ulong)uVar11;
  switch(uVar15) {
  case 2:
    uVar17 = (ulong)(uVar2 * 4);
    bVar18 = false;
    bVar4 = false;
    uVar11 = uVar2;
    break;
  case 3:
    uVar11 = uVar3 + uVar2 * 10;
    bVar18 = true;
    bVar4 = false;
    uVar17 = (ulong)uVar11;
    break;
  case 4:
    bVar4 = true;
    bVar18 = false;
    break;
  case 5:
    if (*liw < (int)uVar11) goto LAB_001112a7;
    uVar11 = uVar3 + uVar2 * 3;
    goto LAB_00111275;
  default:
    if (*liw < (int)uVar11) goto LAB_001112a7;
    goto LAB_001112de;
  }
  if (*liw < (int)uVar17) {
LAB_001112a7:
    *info = -4;
    info[1] = (int_t)uVar17;
    if (*icntl < 0) {
      return 0;
    }
    pcVar13 = " ****** Error in MC64A/AD. INFO(1) = %2d LIW too small, must be at least %8d\n";
    uVar12 = 0xfffffffc;
LAB_001112c6:
    printf(pcVar13,uVar12,uVar17);
    return 0;
  }
  if (1 < uVar15) {
    if (bVar18) {
      uVar11 = uVar3;
    }
    if (bVar4) {
      uVar11 = uVar3 + uVar2 * 2;
    }
LAB_00111275:
    if (*ldw < (int)uVar11) {
      *info = -5;
      info[1] = uVar11;
      if (*icntl < 0) {
        return 0;
      }
      pcVar13 = " ****** Error in MC64A/AD. INFO(1) = %2d LDW too small, must be at least %8d\n";
      uVar12 = 0xfffffffb;
      uVar17 = (ulong)uVar11;
      goto LAB_001112c6;
    }
  }
LAB_001112de:
  if (icntl[3] == 0) {
    memset(iw,0,(long)(int)uVar2 << 2);
    uVar15 = *n;
    if (0 < (int)uVar15) {
      uVar17 = 1;
      do {
        iVar6 = ip[uVar17];
        iVar5 = ip[uVar17 - 1];
        if (iVar5 < iVar6) {
          lVar16 = 0;
          do {
            lVar9 = (long)irn[(long)iVar5 + lVar16 + -1];
            iVar10 = (int_t)uVar17;
            if ((lVar9 < 1) || (*n < irn[(long)iVar5 + lVar16 + -1])) {
              *info = -6;
              info[1] = iVar10;
              if (*icntl < 0) {
                return 0;
              }
              pcVar13 = 
              " ****** Error in MC64A/AD. INFO(1) = %2d Column %8d contains an entry with invalid row index %8d\n"
              ;
              uVar12 = 0xfffffffa;
LAB_00111958:
              printf(pcVar13,uVar12);
              return 0;
            }
            if (uVar17 == (uint)iw[lVar9 + -1]) {
              *info = -7;
              info[1] = iVar10;
              if (*icntl < 0) {
                return 0;
              }
              pcVar13 = 
              " ****** Error in MC64A/AD. INFO(1) = %2d        Column %8d contains two or more entries with row index %8d\n"
              ;
              uVar12 = 0xfffffff9;
              goto LAB_00111958;
            }
            iw[lVar9 + -1] = iVar10;
            lVar16 = lVar16 + 1;
          } while (iVar6 - iVar5 != (int)lVar16);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != (ulong)uVar15 + 1);
    }
  }
  if (-1 < icntl[2]) {
    printf("  ****** Input parameters for MC64A/AD: JOB = %8d, N = %d, NE = %8d\n",(ulong)(uint)*job
           ,(ulong)(uint)*n,(ulong)(uint)*ne);
    printf(" IP(1:N+1)   = ");
    if (-1 < *n) {
      lVar16 = 0;
      do {
        printf("%8d",(ulong)(uint)ip[lVar16]);
        if (((int)lVar16 + 1U & 7) == 0) {
          putchar(10);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 <= *n);
    }
    printf("\n IRN(1:NE) = ");
    if (0 < *ne) {
      lVar16 = 0;
      do {
        printf("%8d",(ulong)(uint)irn[lVar16]);
        if (((int)lVar16 + 1U & 7) == 0) {
          putchar(10);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < *ne);
    }
    putchar(10);
    if (1 < *job) {
      printf(" A(1:NE)     = ");
      if (0 < *ne) {
        lVar16 = 0;
        do {
          printf("%f14.4",a[lVar16]);
          if (((int)lVar16 + 1U & 3) == 0) {
            putchar(10);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < *ne);
      }
      putchar(10);
    }
  }
  info[4] = 0;
  info[5] = 0;
  info[6] = 0;
  info[7] = 0;
  info[0] = 0;
  info[1] = 0;
  info[2] = 0;
  info[3] = 0;
  info[8] = 0;
  info[9] = 0;
  switch(*job) {
  case 1:
    uVar15 = *n;
    if (0 < (int)uVar15) {
      uVar17 = 0;
      do {
        iw[uVar17] = ip[uVar17 + 1] - ip[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    puts(" ****** Warning from MC64A/AD. Need to link mc21ad.");
    break;
  case 2:
    iVar6 = *n;
    mc64bd_(n,iw + iVar6,ip,irn,a,cperm,num,iw,iw + iVar6,iw + (long)(iVar6 * 2 + 1) + -1,
            iw + (long)iVar6 * 3,dw);
    break;
  case 3:
    uVar15 = *ne;
    if (0 < (int)uVar15) {
      uVar17 = 0;
      do {
        iw[uVar17] = irn[uVar17];
        dVar20 = a[uVar17];
        uVar14 = -(ulong)(-dVar20 <= dVar20);
        dw[uVar17] = (double)(~uVar14 & (ulong)-dVar20 | (ulong)dVar20 & uVar14);
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    mc64rd_(n,irn,ip,iw,dw);
    iVar6 = *ne;
    iVar5 = *n;
    mc64sd_(n,ne,ip,iw,dw,cperm,num,iw + iVar6,iw + (iVar5 + iVar6),iw + (iVar6 + iVar5 * 2),
            iw + (iVar5 * 3 + iVar6),iw + (iVar6 + iVar5 * 4),iw + (iVar5 * 5 + iVar6),
            iw + (iVar6 + iVar5 * 6));
    break;
  case 4:
    uVar15 = *n;
    if ((long)(int)uVar15 < 1) {
      uVar17 = (ulong)(uVar15 + 1);
    }
    else {
      uVar17 = (ulong)uVar15 + 1;
      uVar14 = 1;
      iVar10 = *ip;
      do {
        iVar6 = ip[uVar14];
        if (iVar10 < iVar6) {
          lVar16 = (long)iVar10;
          dVar20 = 0.0;
          do {
            dVar21 = a[lVar16 + -1];
            uVar19 = -(ulong)(-dVar21 <= dVar21);
            dVar21 = (double)(~uVar19 & (ulong)-dVar21 | (ulong)dVar21 & uVar19);
            if (dVar21 <= dVar20) {
              dVar21 = dVar20;
            }
            lVar16 = lVar16 + 1;
            dVar20 = dVar21;
          } while (iVar6 != lVar16);
          if (iVar10 < iVar6) {
            lVar16 = (long)iVar10;
            do {
              dVar20 = a[lVar16 + -1];
              uVar19 = -(ulong)(-dVar20 <= dVar20);
              dw[(long)(int)(uVar15 * 2) + lVar16 + -1] =
                   dVar21 - (double)(~uVar19 & (ulong)-dVar20 | (ulong)dVar20 & uVar19);
              lVar16 = lVar16 + 1;
            } while (iVar6 != lVar16);
          }
        }
        uVar14 = uVar14 + 1;
        iVar10 = iVar6;
      } while (uVar14 != uVar17);
    }
    lVar16 = (long)(int)(uVar15 * 2 | 1);
    mc64wd_(n,iw + (long)(int)uVar17 + -1,ip,irn,dw + lVar16 + -1,cperm,num,iw,
            iw + (long)(int)uVar17 + -1,iw + lVar16 + -1,iw + (long)(int)uVar15 * 3,
            iw + (long)(int)(uVar15 * 4 + 1) + -1,dw,dw + (long)(int)uVar17 + -1);
    break;
  case 5:
    uVar15 = *n;
    if (0 < (int)uVar15) {
      lVar16 = 1;
      do {
        iVar5 = ip[lVar16 + -1];
        iVar8 = ip[lVar16];
        iVar6 = *n;
        if (iVar5 < iVar8) {
          lVar9 = (long)iVar5;
          dVar21 = 0.0;
          do {
            dVar1 = a[lVar9 + -1];
            uVar17 = -(ulong)(-dVar1 <= dVar1);
            dVar1 = (double)(~uVar17 & (ulong)-dVar1 | (ulong)dVar1 & uVar17);
            dw[(long)iVar6 * 3 + lVar9 + -1] = dVar1;
            if (dVar1 <= dVar21) {
              dVar1 = dVar21;
            }
            lVar9 = lVar9 + 1;
            dVar21 = dVar1;
          } while (iVar8 != lVar9);
          dw[(long)((int)lVar16 + iVar6 * 2) + -1] = dVar1;
          if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_00111649;
          local_48 = log(dVar1);
          iVar5 = ip[lVar16 + -1];
          iVar8 = ip[lVar16];
        }
        else {
          dw[(long)((int)lVar16 + iVar6 * 2) + -1] = 0.0;
LAB_00111649:
          local_48 = dVar20 / (double)iVar6;
        }
        if (iVar5 < iVar8) {
          uVar17 = (ulong)(uint)*n;
          lVar9 = (long)iVar5;
          do {
            lVar7 = (int)uVar17 * 3 + lVar9;
            dVar21 = dw[lVar7 + -1];
            if ((dVar21 != 0.0) || (NAN(dVar21))) {
              dVar21 = log(dVar21);
              dVar21 = local_48 - dVar21;
              uVar17 = (ulong)*n;
              lVar7 = uVar17 * 3 + lVar9;
            }
            else {
              dVar21 = dVar20 / (double)(int)uVar17;
            }
            dw[lVar7 + -1] = dVar21;
            lVar9 = lVar9 + 1;
          } while (iVar8 != (int)lVar9);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != (ulong)uVar15 + 1);
      uVar15 = *n;
    }
    mc64wd_(n,iw + (int)uVar15,ip,irn,dw + (int)(uVar15 * 3),cperm,num,iw,iw + (int)uVar15,
            iw + (long)(int)(uVar15 * 2 + 1) + -1,iw + (int)(uVar15 * 3),
            iw + (long)(int)(uVar15 * 4 + 1) + -1,dw,dw + (int)uVar15);
    iVar6 = *num;
    if (0 < *n && iVar6 == *n) {
      iVar5 = iVar6;
      iVar8 = 1;
      do {
        dVar21 = dw[(long)(iVar8 + iVar5 * 2) + -1];
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          dVar21 = log(dVar21);
          iVar5 = *n;
          dw[(long)(iVar8 + iVar5) + -1] = dw[(long)(iVar8 + iVar5) + -1] - dVar21;
        }
        else {
          dw[(long)(iVar5 + iVar8) + -1] = 0.0;
        }
        bVar18 = iVar8 != iVar6;
        iVar8 = iVar8 + 1;
      } while (bVar18);
    }
    dVar20 = log(dVar20);
    uVar15 = *n;
    if (0 < (long)(int)uVar15) {
      dVar20 = dVar20 * 0.5;
      uVar17 = 0;
      do {
        if ((dVar20 < dw[uVar17] || dVar20 == dw[uVar17]) ||
           (dVar20 < dw[(long)(int)uVar15 + uVar17] || dVar20 == dw[(long)(int)uVar15 + uVar17])) {
          *info = 2;
          goto LAB_00111b82;
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    break;
  default:
    goto switchD_0011148d_default;
  }
  iVar6 = *info;
  if (iVar6 == 0) {
switchD_0011148d_default:
    if ((*n <= *num) || (*info = 1, icntl[1] < 0)) goto LAB_00111ba3;
    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d The matrix is structurally singular.\n",1);
    iVar6 = *info;
  }
  if (iVar6 == 2) {
LAB_00111b82:
    if (-1 < icntl[1]) {
      printf(" ****** Warning from MC64A/AD. INFO(1) = %2d\n        Some scaling factors may be too large.\n"
             ,2);
    }
  }
LAB_00111ba3:
  if (-1 < icntl[2]) {
    printf(" ****** Output parameters for MC64A/AD: INFO(1:2)  = %8d%8d\n",(ulong)(uint)*info,
           (ulong)(uint)info[1]);
    printf(" NUM        = %8d",(ulong)(uint)*num);
    printf(" CPERM(1:N) = ");
    if (0 < *n) {
      lVar16 = 0;
      do {
        printf("%8d",(ulong)(uint)cperm[lVar16]);
        if (((int)lVar16 + 1U & 7) == 0) {
          putchar(10);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < *n);
    }
    if (*job == 5) {
      printf("\n DW(1:N)    = ");
      if (0 < *n) {
        uVar17 = 1;
        lVar16 = 0;
        do {
          printf("%11.3f",dw[lVar16]);
          if ((int)(uVar17 / 5) * 5 + -1 == (int)lVar16) {
            putchar(10);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 1;
        } while (lVar16 < *n);
      }
      printf("\n DW(N+1:2N) = ");
      iVar6 = *n;
      if (0 < iVar6) {
        uVar17 = 1;
        lVar16 = 0;
        do {
          printf("%11.3f",dw[iVar6 + lVar16]);
          if ((int)(uVar17 / 5) * 5 + -1 == (int)lVar16) {
            putchar(10);
          }
          iVar6 = *n;
          lVar16 = lVar16 + 1;
          uVar17 = uVar17 + 1;
        } while ((int)lVar16 < iVar6);
      }
      putchar(10);
    }
  }
  return 0;
}

Assistant:

int_t mc64ad_(int_t *job, int_t *n, int_t *ne, int_t *
	ip, int_t *irn, double *a, int_t *num, int *cperm, 
	int_t *liw, int_t *iw, int_t *ldw, double *dw, int_t *
	icntl, int_t *info)
{
    /* System generated locals */
    int_t i__1, i__2;
    double d__1, d__2;

    /* Builtin functions */
    double log(double);

    /* Local variables */
    int_t i__, j, k;
    double fact, rinf;

    extern /* Subroutine */ int_t mc21ad_(int_t *, int_t *, int_t *, 
	    int_t *, int_t *, int_t *, int_t *, int_t *),
	mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *num, int_t *jperm, 
		int_t *pr, int_t *q, int_t *l, double *d__),
	mc64rd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a),
	mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *numx, int_t *w, int_t *len, int_t *lenl,
		int_t *lenh, int_t *fc, int_t *iw, int_t *iw4),
	mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *num, int_t *jperm, int_t *out,
		int_t *pr, int_t *q, int_t *l, double *u, double *d__);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/*  Purpose */
/*  ======= */

/* This subroutine attempts to find a column permutation for an NxN */
/* sparse matrix A = {a_ij} that makes the permuted matrix have N */
/* entries on its diagonal. */
/* If the matrix is structurally nonsingular, the subroutine optionally */
/* returns a column permutation that maximizes the smallest element */
/* on the diagonal, maximizes the sum of the diagonal entries, or */
/* maximizes the product of the diagonal entries of the permuted matrix. */
/* For the latter option, the subroutine also finds scaling factors */
/* that may be used to scale the matrix so that the nonzero diagonal */
/* entries of the permuted matrix are one in absolute value and all the */
/* off-diagonal entries are less than or equal to one in absolute value. */
/* The natural logarithms of the scaling factors u(i), i=1..N, for the */
/* rows and v(j), j=1..N, for the columns are returned so that the */
/* scaled matrix B = {b_ij} has entries b_ij = a_ij * EXP(u_i + v_j). */

/*  Parameters */
/*  ========== */


/* JOB is an INT_T variable which must be set by the user to */
/* control the action. It is not altered by the subroutine. */
/* Possible values for JOB are: */
/*   1 Compute a column permutation of the matrix so that the */
/*     permuted matrix has as many entries on its diagonal as possible. */
/*     The values on the diagonal are of arbitrary size. HSL subroutine */
/*     MC21A/AD is used for this. See [1]. */
/*   2 Compute a column permutation of the matrix so that the smallest */
/*     value on the diagonal of the permuted matrix is maximized. */
/*     See [3]. */
/*   3 Compute a column permutation of the matrix so that the smallest */
/*     value on the diagonal of the permuted matrix is maximized. */
/*     The algorithm differs from the one used for JOB = 2 and may */
/*     have quite a different performance. See [2]. */
/*   4 Compute a column permutation of the matrix so that the sum */
/*     of the diagonal entries of the permuted matrix is maximized. */
/*     See [3]. */
/*   5 Compute a column permutation of the matrix so that the product */
/*     of the diagonal entries of the permuted matrix is maximized */
/*     and vectors to scale the matrix so that the nonzero diagonal */
/*     entries of the permuted matrix are one in absolute value and */
/*     all the off-diagonal entries are less than or equal to one in */
/*     absolute value. See [3]. */
/*  Restriction: 1 <= JOB <= 5. */

/* N is an INT_T variable which must be set by the user to the */
/*   order of the matrix A. It is not altered by the subroutine. */
/*   Restriction: N >= 1. */

/* NE is an INT_T variable which must be set by the user to the */
/*   number of entries in the matrix. It is not altered by the */
/*   subroutine. */
/*   Restriction: NE >= 1. */

/* IP is an INT_T array of length N+1. */
/*   IP(J), J=1..N, must be set by the user to the position in array IRN */
/*   of the first row index of an entry in column J. IP(N+1) must be set */
/*   to NE+1. It is not altered by the subroutine. */

/* IRN is an INT_T array of length NE. */
/*   IRN(K), K=1..NE, must be set by the user to hold the row indices of */
/*   the entries of the matrix. Those belonging to column J must be */
/*   stored contiguously in the positions IP(J)..IP(J+1)-1. The ordering */
/*   of the row indices within each column is unimportant. Repeated */
/*   entries are not allowed. The array IRN is not altered by the */
/*   subroutine. */

/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   The user must set A(K), K=1..NE, to the numerical value of the */
/*   entry that corresponds to IRN(K). */
/*   It is not used by the subroutine when JOB = 1. */
/*   It is not altered by the subroutine. */

/* NUM is an INT_T variable that need not be set by the user. */
/*   On successful exit, NUM will be the number of entries on the */
/*   diagonal of the permuted matrix. */
/*   If NUM < N, the matrix is structurally singular. */

/* CPERM is an INT_T array of length N that need not be set by the */
/*   user. On successful exit, CPERM contains the column permutation. */
/*   Column CPERM(J) of the original matrix is column J in the permuted */
/*   matrix, J=1..N. */

/* LIW is an INT_T variable that must be set by the user to */
/*   the dimension of array IW. It is not altered by the subroutine. */
/*   Restriction: */
/*     JOB = 1 :  LIW >= 5N */
/*     JOB = 2 :  LIW >= 4N */
/*     JOB = 3 :  LIW >= 10N + NE */
/*     JOB = 4 :  LIW >= 5N */
/*     JOB = 5 :  LIW >= 5N */

/* IW is an INT_T array of length LIW that is used for workspace. */

/* LDW is an INT_T variable that must be set by the user to the */
/*   dimension of array DW. It is not altered by the subroutine. */
/*   Restriction: */
/*     JOB = 1 :  LDW is not used */
/*     JOB = 2 :  LDW >= N */
/*     JOB = 3 :  LDW >= NE */
/*     JOB = 4 :  LDW >= 2N + NE */
/*     JOB = 5 :  LDW >= 3N + NE */

/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length LDW */
/*   that is used for workspace. If JOB = 5, on return, */
/*   DW(i) contains u_i, i=1..N, and DW(N+j) contains v_j, j=1..N. */

/* ICNTL is an INT_T array of length 10. Its components control the */
/*   output of MC64A/AD and must be set by the user before calling */
/*   MC64A/AD. They are not altered by the subroutine. */

/*   ICNTL(1) must be set to specify the output stream for */
/*   error messages. If ICNTL(1) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is 6. */

/*   ICNTL(2) must be set by the user to specify the output stream for */
/*   warning messages. If ICNTL(2) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is 6. */

/*   ICNTL(3) must be set by the user to specify the output stream for */
/*   diagnostic messages. If ICNTL(3) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is -1. */

/*   ICNTL(4) must be set by the user to a value other than 0 to avoid */
/*   checking of the input data. */
/*   The default value set by MC46I/ID is 0. */

/* INFO is an INT_T array of length 10 which need not be set by the */
/*   user. INFO(1) is set non-negative to indicate success. A negative */
/*   value is returned if an error occurred, a positive value if a */
/*   warning occurred. INFO(2) holds further information on the error. */
/*   On exit from the subroutine, INFO(1) will take one of the */
/*   following values: */
/*    0 : successful entry (for structurally nonsingular matrix). */
/*   +1 : successful entry (for structurally singular matrix). */
/*   +2 : the returned scaling factors are large and may cause */
/*        overflow when used to scale the matrix. */
/*        (For JOB = 5 entry only.) */
/*   -1 : JOB < 1 or JOB > 5.  Value of JOB held in INFO(2). */
/*   -2 : N < 1.  Value of N held in INFO(2). */
/*   -3 : NE < 1. Value of NE held in INFO(2). */
/*   -4 : the defined length LIW violates the restriction on LIW. */
/*        Value of LIW required given by INFO(2). */
/*   -5 : the defined length LDW violates the restriction on LDW. */
/*        Value of LDW required given by INFO(2). */
/*   -6 : entries are found whose row indices are out of range. INFO(2) */
/*        contains the index of a column in which such an entry is found. */
/*   -7 : repeated entries are found. INFO(2) contains the index of a */
/*        column in which such entries are found. */
/*  INFO(3) to INFO(10) are not currently used and are set to zero by */
/*        the routine. */

/* References: */
/*  [1]  I. S. Duff, (1981), */
/*       "Algorithm 575. Permutations for a zero-free diagonal", */
/*       ACM Trans. Math. Software 7(3), 387-390. */
/*  [2]  I. S. Duff and J. Koster, (1998), */
/*       "The design and use of algorithms for permuting large */
/*       entries to the diagonal of sparse matrices", */
/*       SIAM J. Matrix Anal. Appl., vol. 20, no. 4, pp. 889-901. */
/*  [3]  I. S. Duff and J. Koster, (1999), */
/*       "On algorithms for permuting large entries to the diagonal */
/*       of sparse matrices", */
/*       Technical Report RAL-TR-1999-030, RAL, Oxfordshire, England. */
/* Local variables and parameters */
/* External routines and functions */
/*     EXTERNAL FD05AD */
/*     DOUBLE PRECISION FD05AD */
/* Intrinsic functions */
/* Set RINF to largest positive real number (infinity) */
/* XSL    RINF = FD05AD(5) */
    /* Parameter adjustments */
    --cperm;
    --ip;
    --a;
    --irn;
    --iw;
    --dw;
    --icntl;
    --info;

    /* Function Body */
    rinf = dmach("Overflow");
/* Check value of JOB */
    if (*job < 1 || *job > 5) {
	info[1] = -1;
	info[2] = *job;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because JOB = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check value of N */
    if (*n < 1) {
	info[1] = -2;
	info[2] = *n;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because N = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check value of NE */
    if (*ne < 1) {
	info[1] = -3;
	info[2] = *ne;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because NE = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check LIW */
    if (*job == 1) {
	k = *n * 5;
    }
    if (*job == 2) {
	k = *n << 2;
    }
    if (*job == 3) {
	k = *n * 10 + *ne;
    }
    if (*job == 4) {
	k = *n * 5;
    }
    if (*job == 5) {
	k = *n * 5;
    }
    if (*liw < k) {
	info[1] = -4;
	info[2] = k;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " LIW too small, must be at least %8d\n", (int) info[1], (int) k);
	}
	goto L99;
    }
/* Check LDW */
/* If JOB = 1, do not check */
    if (*job > 1) {
	if (*job == 2) {
	    k = *n;
	}
	if (*job == 3) {
	    k = *ne;
	}
	if (*job == 4) {
	    k = (*n << 1) + *ne;
	}
	if (*job == 5) {
	    k = *n * 3 + *ne;
	}
	if (*ldw < k) {
	    info[1] = -5;
	    info[2] = k;
	    if (icntl[1] >= 0) {
		printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		       " LDW too small, must be at least %8d\n", (int) info[1], (int) k);
	    }
	    goto L99;
	}
    }
    if (icntl[4] == 0) {
/* Check row indices. Use IW(1:N) as workspace */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    iw[i__] = 0;
/* L3: */
	}
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		i__ = irn[k];
/* Check for row indices that are out of range */
		if (i__ < 1 || i__ > *n) {
		    info[1] = -6;
		    info[2] = j;
		    if (icntl[1] >= 0) {
			printf(" ****** Error in MC64A/AD. INFO(1) = %2d Column %8d"
			       " contains an entry with invalid row index %8d\n",
			       (int) info[1], (int) j, (int) i__);
		    }
		    goto L99;
		}
/* Check for repeated row indices within a column */
		if (iw[i__] == j) {
		    info[1] = -7;
		    info[2] = j;
		    if (icntl[1] >= 0) {
			printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
			       "        Column %8d"
			       " contains two or more entries with row index %8d\n",
			       (int) info[1], (int) j, (int) i__);
		    }
		    goto L99;
		} else {
		    iw[i__] = j;
		}
/* L4: */
	    }
/* L6: */
	    }
    }
/* Print diagnostics on input */
    if (icntl[3] >= 0) {
	printf("  ****** Input parameters for MC64A/AD: JOB = %8d,"
	       " N = %d, NE = %8d\n", (int) *job, (int) *n, (int) *ne);
	printf(" IP(1:N+1)   = ");
	for (j=1; j<=(*n+1); ++j) {
	    printf("%8d", (int) ip[j]);
	    if (j%8 == 0) printf("\n");
	}
	printf("\n IRN(1:NE) = ");
	for (j=1; j<=(*ne); ++j) {
	    printf("%8d", (int) irn[j]);
	    if (j%8 == 0) printf("\n");
	}
	printf("\n");

	if (*job > 1) {
	    printf(" A(1:NE)     = ");
	    for (j=1; j<=(*ne); ++j) {
		printf("%f14.4", a[j]);
		if (j%4 == 0) printf("\n");
	    }
	    printf("\n");
	}
    }
/* Set components of INFO to zero */
    for (i__ = 1; i__ <= 10; ++i__) {
	info[i__] = 0;
/* L8: */
    }
/* Compute maximum matching with MC21A/AD */
    if (*job == 1) {
/* Put length of column J in IW(J) */
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    iw[j] = ip[j + 1] - ip[j];
/* L10: */
	}
/* IW(N+1:5N) is workspace */
#if 0
	mc21ad_(n, &irn[1], ne, &ip[1], &iw[1], &cperm[1], num, &iw[*n+1]);
#else
	printf(" ****** Warning from MC64A/AD. Need to link mc21ad.\n");
#endif
	goto L90;
    }
/* Compute bottleneck matching */
    if (*job == 2) {
/* IW(1:5N), DW(1:N) are workspaces */
	mc64bd_(n, ne, &ip[1], &irn[1], &a[1], &cperm[1], num, &iw[1], &iw[*n 
		+ 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &dw[1]);
	goto L90;
    }
/* Compute bottleneck matching */
    if (*job == 3) {
/* Copy IRN(K) into IW(K), ABS(A(K)) into DW(K), K=1..NE */
	i__1 = *ne;
	for (k = 1; k <= i__1; ++k) {
	    iw[k] = irn[k];
	    dw[k] = (d__1 = a[k], abs(d__1));
/* L20: */
	}
/* Sort entries in each column by decreasing value. */
	mc64rd_(n, ne, &ip[1], &iw[1], &dw[1]);
/* IW(NE+1:NE+10N) is workspace */
	mc64sd_(n, ne, &ip[1], &iw[1], &dw[1], &cperm[1], num, &iw[*ne + 1], &
		iw[*ne + *n + 1], &iw[*ne + (*n << 1) + 1], &iw[*ne + *n * 3 
		+ 1], &iw[*ne + (*n << 2) + 1], &iw[*ne + *n * 5 + 1], &iw[*
		ne + *n * 6 + 1]);
	goto L90;
    }
    if (*job == 4) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    fact = 0.;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if ((d__1 = a[k], abs(d__1)) > fact) {
		    fact = (d__2 = a[k], abs(d__2));
		}
/* L30: */
	    }
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		dw[(*n << 1) + k] = fact - (d__1 = a[k], abs(d__1));
/* L40: */
	    }
/* L50: */
	}
/* B = DW(2N+1:2N+NE); IW(1:5N) and DW(1:2N) are workspaces */
	mc64wd_(n, ne, &ip[1], &irn[1], &dw[(*n << 1) + 1], &cperm[1], num, &
		iw[1], &iw[*n + 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &iw[(
		*n << 2) + 1], &dw[1], &dw[*n + 1]);
	goto L90;
    }
    if (*job == 5) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    fact = 0.;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		dw[*n * 3 + k] = (d__1 = a[k], abs(d__1));
		if (dw[*n * 3 + k] > fact) {
		    fact = dw[*n * 3 + k];
		}
/* L60: */
	    }
	    dw[(*n << 1) + j] = fact;
	    if (fact != 0.) {
		fact = log(fact);
	    } else {
		fact = rinf / *n;
	    }
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (dw[*n * 3 + k] != 0.) {
		    dw[*n * 3 + k] = fact - log(dw[*n * 3 + k]);
		} else {
		    dw[*n * 3 + k] = rinf / *n;
		}
/* L70: */
	    }
/* L75: */
	}
/* B = DW(3N+1:3N+NE); IW(1:5N) and DW(1:2N) are workspaces */
	mc64wd_(n, ne, &ip[1], &irn[1], &dw[*n * 3 + 1], &cperm[1], num, &iw[
		1], &iw[*n + 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &iw[(*n 
		<< 2) + 1], &dw[1], &dw[*n + 1]);
	if (*num == *n) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (dw[(*n << 1) + j] != 0.) {
		    dw[*n + j] -= log(dw[(*n << 1) + j]);
		} else {
		    dw[*n + j] = 0.;
		}
/* L80: */
	    }
	}
/* Check size of scaling factors */
	fact = log(rinf) * .5f;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    if (dw[j] < fact && dw[*n + j] < fact) {
		goto L86;
	    }
	    info[1] = 2;
	    goto L90;
L86:
	    ;
	}
/*       GO TO 90 */
    }
L90:
    if (info[1] == 0 && *num < *n) {
/* Matrix is structurally singular, return with warning */
	info[1] = 1;
	if (icntl[2] >= 0) {
	    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d"
		   " The matrix is structurally singular.\n", (int)info[1]);
	}
    }
    if (info[1] == 2) {
/* Scaling factors are large, return with warning */
	if (icntl[2] >= 0) {
	    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d\n"
		   "        Some scaling factors may be too large.\n", (int) info[1]);
	}
    }
/* Print diagnostics on output */
    if (icntl[3] >= 0) {
	printf(" ****** Output parameters for MC64A/AD: INFO(1:2)  = %8d%8d\n",
	       (int) info[1], (int) info[2]);
	printf(" NUM        = %8d", (int) *num);
	printf(" CPERM(1:N) = ");
	for (j=1; j<=*n; ++j) {
	    printf("%8d", (int) cperm[j]);
	    if (j%8 == 0) printf("\n");
	}
	if (*job == 5) {
	    printf("\n DW(1:N)    = ");
	    for (j=1; j<=*n; ++j) {
		printf("%11.3f", dw[j]);
		if (j%5 == 0) printf("\n");
	    }
	    printf("\n DW(N+1:2N) = ");
	    for (j=1; j<=*n; ++j) {
		printf("%11.3f", dw[*n+j]);
		if (j%5 == 0) printf("\n");
	    }
	    printf("\n");
	}
    }
/* Return from subroutine. */
L99:
    return 0;
}